

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O1

void leveldb::_Test_StartThread::_RunIt(void)

{
  _Test_StartThread t;
  _Test_StartThread local_8;
  
  local_8.super_EnvTest.env_ = (EnvTest)Env::Default();
  _Run(&local_8);
  return;
}

Assistant:

TEST(EnvTest, StartThread) {
  State state(0, 3);
  for (int i = 0; i < 3; i++) {
    env_->StartThread(&ThreadBody, &state);
  }
  while (true) {
    state.mu.Lock();
    int num = state.num_running;
    state.mu.Unlock();
    if (num == 0) {
      break;
    }
    env_->SleepForMicroseconds(kDelayMicros);
  }

  MutexLock l(&state.mu);
  ASSERT_EQ(state.val, 3);
}